

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_operation.c
# Opt level: O0

void async_operation_destroy(ASYNC_OPERATION_HANDLE async_operation)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  ASYNC_OPERATION_HANDLE async_operation_local;
  
  if (async_operation == (ASYNC_OPERATION_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/async_operation.c"
                ,"async_operation_destroy",0x3a,1,"NULL async_operation");
    }
  }
  else {
    free(async_operation);
  }
  return;
}

Assistant:

void async_operation_destroy(ASYNC_OPERATION_HANDLE async_operation)
{
    if (async_operation == NULL)
    {
        /* Codes_SRS_ASYNC_OPERATION_01_006: [ If `async_operation` is NULL, `async_operation_destroy` shall do nothing.]*/
        LogError("NULL async_operation");
    }
    else
    {
        /* Codes_SRS_ASYNC_OPERATION_01_005: [ `async_operation_destroy` shall free all recources associated with the asyncronous operation instance.]*/
        free(async_operation);
    }
}